

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConvexHullShape
          (BulletEngine *this,aphy_scalar *coordinates,aphy_size num_points,aphy_size stride)

{
  btConvexHullShape *this_00;
  BulletCollisionShape *this_01;
  collision_shape_ptr prVar1;
  
  this_00 = (btConvexHullShape *)btAlignedAllocInternal(0x98,0x10);
  btConvexHullShape::btConvexHullShape(this_00,coordinates,num_points,stride);
  this_01 = (BulletCollisionShape *)operator_new(0x20);
  BulletCollisionShape::BulletCollisionShape(this_01,(btCollisionShape *)this_00,Generic);
  prVar1 = (collision_shape_ptr)operator_new(0x18);
  prVar1->dispatchTable = (aphy_icd_dispatch *)aphy::cppRefcountedDispatchTable;
  prVar1->object = (collision_shape *)this_01;
  prVar1->strongCount = (__atomic_base<unsigned_int>)0x1;
  prVar1->weakCount = (__atomic_base<unsigned_int>)0x0;
  (this_01->super_collision_shape).super_base_interface.myRefCounter = prVar1;
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConvexHullShape(aphy_scalar* coordinates, aphy_size num_points, aphy_size stride)
{
    return makeObject<BulletCollisionShape> (
        new btConvexHullShape(coordinates, num_points, stride)
    ).disown();
}